

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O0

void __thiscall diff_match_patch_test::testMatchMain(diff_match_patch_test *this)

{
  int iVar1;
  allocator<wchar_t> local_271;
  wstring local_270 [39];
  allocator<wchar_t> local_249;
  wstring local_248 [39];
  allocator<wchar_t> local_221;
  wstring local_220;
  allocator<wchar_t> local_1f9;
  wstring local_1f8 [39];
  allocator<wchar_t> local_1d1;
  wstring local_1d0 [39];
  allocator<wchar_t> local_1a9;
  wstring local_1a8;
  allocator<wchar_t> local_181;
  wstring local_180 [39];
  allocator<wchar_t> local_159;
  wstring local_158 [39];
  allocator<wchar_t> local_131;
  wstring local_130;
  allocator<wchar_t> local_109;
  wstring local_108 [39];
  allocator<wchar_t> local_e1;
  wstring local_e0 [39];
  allocator<wchar_t> local_b9;
  wstring local_b8;
  allocator<wchar_t> local_91;
  wstring local_90 [39];
  allocator<wchar_t> local_69;
  wstring local_68 [55];
  allocator<wchar_t> local_31;
  wstring local_30;
  diff_match_patch_test *local_10;
  diff_match_patch_test *this_local;
  
  local_10 = this;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_30,L"match_main: Equality.",&local_31);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"abcdef",&local_69);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_90,L"abcdef",&local_91);
  iVar1 = diff_match_patch::match_main((wstring *)this,local_68,(int)local_90);
  assertEquals(this,&local_30,0,iVar1);
  std::__cxx11::wstring::~wstring(local_90);
  std::allocator<wchar_t>::~allocator(&local_91);
  std::__cxx11::wstring::~wstring(local_68);
  std::allocator<wchar_t>::~allocator(&local_69);
  std::__cxx11::wstring::~wstring((wstring *)&local_30);
  std::allocator<wchar_t>::~allocator(&local_31);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_b8,L"match_main: Null text.",&local_b9);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_e0,L"",&local_e1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_108,L"abcdef",&local_109);
  iVar1 = diff_match_patch::match_main((wstring *)this,local_e0,(int)local_108);
  assertEquals(this,&local_b8,-1,iVar1);
  std::__cxx11::wstring::~wstring(local_108);
  std::allocator<wchar_t>::~allocator(&local_109);
  std::__cxx11::wstring::~wstring(local_e0);
  std::allocator<wchar_t>::~allocator(&local_e1);
  std::__cxx11::wstring::~wstring((wstring *)&local_b8);
  std::allocator<wchar_t>::~allocator(&local_b9);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_130,L"match_main: Null pattern.",&local_131);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_158,L"abcdef",&local_159);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_180,L"",&local_181);
  iVar1 = diff_match_patch::match_main((wstring *)this,local_158,(int)local_180);
  assertEquals(this,&local_130,3,iVar1);
  std::__cxx11::wstring::~wstring(local_180);
  std::allocator<wchar_t>::~allocator(&local_181);
  std::__cxx11::wstring::~wstring(local_158);
  std::allocator<wchar_t>::~allocator(&local_159);
  std::__cxx11::wstring::~wstring((wstring *)&local_130);
  std::allocator<wchar_t>::~allocator(&local_131);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_1a8,L"match_main: Exact match.",&local_1a9);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1d0,L"abcdef",&local_1d1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1f8,L"de",&local_1f9);
  iVar1 = diff_match_patch::match_main((wstring *)this,local_1d0,(int)local_1f8);
  assertEquals(this,&local_1a8,3,iVar1);
  std::__cxx11::wstring::~wstring(local_1f8);
  std::allocator<wchar_t>::~allocator(&local_1f9);
  std::__cxx11::wstring::~wstring(local_1d0);
  std::allocator<wchar_t>::~allocator(&local_1d1);
  std::__cxx11::wstring::~wstring((wstring *)&local_1a8);
  std::allocator<wchar_t>::~allocator(&local_1a9);
  *(undefined4 *)&this->field_0x8 = 0x3f333333;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_220,L"match_main: Complex match.",&local_221);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_248,L"I am the very model of a modern major general.",&local_249);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_270,L" that berry ",&local_271);
  iVar1 = diff_match_patch::match_main((wstring *)this,local_248,(int)local_270);
  assertEquals(this,&local_220,4,iVar1);
  std::__cxx11::wstring::~wstring(local_270);
  std::allocator<wchar_t>::~allocator(&local_271);
  std::__cxx11::wstring::~wstring(local_248);
  std::allocator<wchar_t>::~allocator(&local_249);
  std::__cxx11::wstring::~wstring((wstring *)&local_220);
  std::allocator<wchar_t>::~allocator(&local_221);
  *(undefined4 *)&this->field_0x8 = 0x3f000000;
  return;
}

Assistant:

void diff_match_patch_test::testMatchMain() {
  // Full match.
  assertEquals(L"match_main: Equality.", 0, dmp.match_main(L"abcdef", L"abcdef", 1000));

  assertEquals(L"match_main: Null text.", -1, dmp.match_main(L"", L"abcdef", 1));

  assertEquals(L"match_main: Null pattern.", 3, dmp.match_main(L"abcdef", L"", 3));

  assertEquals(L"match_main: Exact match.", 3, dmp.match_main(L"abcdef", L"de", 3));

  dmp.Match_Threshold = 0.7f;
  assertEquals(L"match_main: Complex match.", 4, dmp.match_main(L"I am the very model of a modern major general.", L" that berry ", 5));
  dmp.Match_Threshold = 0.5f;
}